

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall
httplib::Stream::write_format<char_const*,char_const*>
          (Stream *this,char *fmt,char **args,char **args_1)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  value_type *__val;
  long lVar4;
  char buf [2048];
  vector<char,_std::allocator<char>_> local_858;
  Stream *local_840;
  char local_838 [2056];
  
  uVar2 = snprintf(local_838,0x7ff,fmt,*args,*args_1);
  if (0 < (int)uVar2) {
    if (uVar2 < 0x7ff) {
      (*this->_vptr_Stream[3])(this,local_838,(ulong)uVar2);
    }
    else {
      lVar4 = 0x800;
      local_840 = this;
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)operator_new(0x800);
      pcVar1 = local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + 0x800;
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pcVar1;
      memset(local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,0,0x800);
      local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar1;
      do {
        std::vector<char,_std::allocator<char>_>::resize(&local_858,lVar4 * 2);
        iVar3 = snprintf(local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (size_t)(local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_finish +
                                 ~(ulong)local_858.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start),fmt,*args,*args_1
                        );
        lVar4 = (long)local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
      } while ((int)lVar4 + -1 <= iVar3);
      (*local_840->_vptr_Stream[3])
                (local_840,
                 local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,(long)iVar3);
      if (local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (char *)0x0) {
        operator_delete(local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_858.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

inline void Stream::write_format(const char* fmt, const Args& ...args)
{
    const auto bufsiz = 2048;
    char buf[bufsiz];

#if defined(_MSC_VER) && _MSC_VER < 1900
    auto n = _snprintf_s(buf, bufsiz, bufsiz - 1, fmt, args...);
#else
    auto n = snprintf(buf, bufsiz - 1, fmt, args...);
#endif
    if (n > 0) {
        if (n >= bufsiz - 1) {
            std::vector<char> glowable_buf(bufsiz);

            while (n >= static_cast<int>(glowable_buf.size() - 1)) {
                glowable_buf.resize(glowable_buf.size() * 2);
#if defined(_MSC_VER) && _MSC_VER < 1900
                n = _snprintf_s(&glowable_buf[0], glowable_buf.size(), glowable_buf.size() - 1, fmt, args...);
#else
                n = snprintf(&glowable_buf[0], glowable_buf.size() - 1, fmt, args...);
#endif
            }
            write(&glowable_buf[0], n);
        } else {
            write(buf, n);
        }
    }
}